

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAnimationTimer::~QAnimationTimer(QAnimationTimer *this)

{
  QAnimationTimer *in_RDI;
  
  ~QAnimationTimer(in_RDI);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

QAnimationTimer::~QAnimationTimer()
    = default;